

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O3

bool __thiscall
crnlib::command_line_params::get_value_as_string
          (command_line_params *this,char *pKey,uint index,dynamic_string *value,uint value_index)

{
  bool bVar1;
  param_map_const_iterator pVar2;
  
  pVar2 = get_param(this,pKey,index);
  if (((_Rb_tree_header *)pVar2._M_node == &(this->m_param_map)._M_t._M_impl.super__Rb_tree_header)
     || (*(uint *)&pVar2._M_node[1]._M_right <= value_index)) {
    dynamic_string::empty(value);
    bVar1 = false;
  }
  else {
    dynamic_string::set(value,(dynamic_string *)
                              (&(pVar2._M_node[1]._M_left)->_M_color + (ulong)value_index * 4),
                        0xffffffff);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool command_line_params::get_value_as_string(const char* pKey, uint index, dynamic_string& value, uint value_index) const
    {
        param_map_const_iterator it = get_param(pKey, index);
        if ((it == end()) || (value_index >= it->second.m_values.size()))
        {
            value.empty();
            return false;
        }

        value = it->second.m_values[value_index];
        return true;
    }